

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::Print
          (TextGenerator *this,char *text,size_t size)

{
  char *in_RDX;
  long in_RSI;
  size_t in_RDI;
  size_t i;
  size_t pos;
  char *in_stack_ffffffffffffffd8;
  char *data;
  TextGenerator *in_stack_ffffffffffffffe0;
  TextGenerator *this_00;
  
  if (*(int *)(in_RDI + 0x20) < 1) {
    Write(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI);
    if ((in_RDX != (char *)0x0) && (in_RDX[in_RSI + -1] == '\n')) {
      *(undefined1 *)(in_RDI + 0x1c) = 1;
    }
  }
  else {
    this_00 = (TextGenerator *)0x0;
    for (data = (char *)0x0; data < in_RDX; data = data + 1) {
      if (data[in_RSI] == '\n') {
        Write(this_00,data,in_RDI);
        this_00 = (TextGenerator *)(data + 1);
        *(undefined1 *)(in_RDI + 0x1c) = 1;
      }
    }
    Write(this_00,data,in_RDI);
  }
  return;
}

Assistant:

void Print(const char* text, size_t size) override {
    if (indent_level_ > 0) {
      size_t pos = 0;  // The number of bytes we've written so far.
      for (size_t i = 0; i < size; i++) {
        if (text[i] == '\n') {
          // Saw newline.  If there is more text, we may need to insert an
          // indent here.  So, write what we have so far, including the '\n'.
          Write(text + pos, i - pos + 1);
          pos = i + 1;

          // Setting this true will cause the next Write() to insert an indent
          // first.
          at_start_of_line_ = true;
        }
      }
      // Write the rest.
      Write(text + pos, size - pos);
    } else {
      Write(text, size);
      if (size > 0 && text[size - 1] == '\n') {
        at_start_of_line_ = true;
      }
    }
  }